

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)303>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  undefined1 *nn;
  undefined1 *puVar2;
  ValidationPolicy validationPolicy;
  Result r;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputBlobNames;
  ValidationPolicy local_7c;
  undefined1 local_78 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  ValidationPolicy::ValidationPolicy(&local_7c,MLModelType_neuralNetworkRegressor);
  puVar2 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar2 == (ModelDescription *)0x0) {
    puVar2 = Specification::_ModelDescription_default_instance_;
  }
  validateRegressorInterface
            ((Result *)local_78,(ModelDescription *)puVar2,format->specificationversion_,&local_7c);
  bVar1 = Result::good((Result *)local_78);
  if (bVar1) {
    local_50._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_50._M_impl.super__Rb_tree_header._M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    puVar2 = (undefined1 *)format->description_;
    if ((ModelDescription *)puVar2 == (ModelDescription *)0x0) {
      puVar2 = Specification::_ModelDescription_default_instance_;
    }
    if (format->_oneof_case_[0] == 0x12f) {
      nn = (undefined1 *)(format->Type_).neuralnetworkregressor_;
    }
    else {
      nn = Specification::_NeuralNetworkRegressor_default_instance_;
    }
    local_50._M_impl.super__Rb_tree_header._M_header._M_right =
         local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkRegressor>
              (__return_storage_ptr__,(ModelDescription *)puVar2,(NeuralNetworkRegressor *)nn,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_50,format->isupdatable_,&local_7c);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_50);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_78);
  }
  std::__cxx11::string::~string((string *)(local_78 + 8));
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_neuralNetworkRegressor>(const Specification::Model& format) {
        auto validationPolicy = ValidationPolicy(MLModelType_neuralNetworkRegressor);

        // must have regressor parameters
        Result r = validateRegressorInterface(format.description(), format.specificationversion(), validationPolicy);
        if (!r.good()) {
            return r;
        }

        std::set<std::string> outputBlobNames;
        return validateNeuralNetworkTopLevel(format.description(), format.neuralnetworkregressor(), outputBlobNames, format.isupdatable(), validationPolicy);
    }